

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatevulnerability.cpp
# Opt level: O0

void __thiscall ValidateVulnerability::CheckAllIntensityBinsPresent(ValidateVulnerability *this)

{
  FILE *pFVar1;
  bool bVar2;
  pointer ppVar3;
  size_type sVar4;
  size_type sVar5;
  iterator __first1;
  iterator __last1;
  iterator __first2;
  iterator __last2;
  iterator __i;
  uint *puVar6;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> iVar7;
  _Self local_c8;
  _Self local_c0;
  iterator missBinsIter;
  char cStack_ad;
  int numberOfMissingBinsLeft;
  set<int,_std::less<int>,_std::allocator<int>_> *psStack_a8;
  char bins [5];
  undefined1 local_50 [8];
  set<int,_std::less<int>,_std::allocator<int>_> missingIntensityBins;
  _Self local_18;
  iterator iter;
  ValidateVulnerability *this_local;
  
  iter._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
       ::begin(&this->vulIDToIntBinIDs_);
  while( true ) {
    missingIntensityBins._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::
                 map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                 ::end(&this->vulIDToIntBinIDs_);
    bVar2 = std::operator!=(&local_18,
                            (_Self *)&missingIntensityBins._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count);
    if (!bVar2) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             ::operator->(&local_18);
    sVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::size(&ppVar3->second);
    sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::size(&this->intensityBinIDs_);
    if (sVar4 != sVar5) {
      (this->super_Validate).warnings_ = true;
      std::set<int,_std::less<int>,_std::allocator<int>_>::set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)local_50);
      __first1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&this->intensityBinIDs_)
      ;
      __last1 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->intensityBinIDs_);
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
               ::operator->(&local_18);
      __first2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&ppVar3->second);
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
               ::operator->(&local_18);
      __last2 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(&ppVar3->second);
      __i = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)local_50);
      iVar7 = std::inserter<std::set<int,std::less<int>,std::allocator<int>>>
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)local_50,__i);
      iVar7 = std::
              set_difference<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>>
                        ((_Rb_tree_const_iterator<int>)__first1._M_node,
                         (_Rb_tree_const_iterator<int>)__last1._M_node,
                         (_Rb_tree_const_iterator<int>)__first2._M_node,
                         (_Rb_tree_const_iterator<int>)__last2._M_node,iVar7);
      psStack_a8 = iVar7.container;
      _cStack_ad = 0x6e6962;
      numberOfMissingBinsLeft._3_1_ = 0;
      sVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)local_50);
      if (1 < sVar4) {
        strcat(&cStack_ad,"s");
      }
      pFVar1 = _stderr;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
               ::operator->(&local_18);
      fprintf(pFVar1,"WARNING: Vulnerability ID %d: Intensity %s ",(ulong)(uint)ppVar3->first,
              &cStack_ad);
      sVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)local_50);
      missBinsIter._M_node._4_4_ = (int)sVar4;
      local_c0._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)local_50);
      while( true ) {
        local_c8._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::end
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)local_50);
        bVar2 = std::operator!=(&local_c0,&local_c8);
        pFVar1 = _stderr;
        if (!bVar2) break;
        puVar6 = (uint *)std::_Rb_tree_const_iterator<int>::operator*(&local_c0);
        fprintf(pFVar1,"%d",(ulong)*puVar6);
        if (missBinsIter._M_node._4_4_ < 3) {
          if (missBinsIter._M_node._4_4_ == 2) {
            fprintf(_stderr," and ");
          }
        }
        else {
          fprintf(_stderr,", ");
        }
        missBinsIter._M_node._4_4_ = missBinsIter._M_node._4_4_ + -1;
        std::_Rb_tree_const_iterator<int>::operator++(&local_c0);
      }
      fprintf(_stderr,
              " missing. All intensity bins must be present for each vulnerability ID in single peril models.\n"
             );
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)local_50);
    }
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>::
    operator++(&local_18);
  }
  return;
}

Assistant:

void ValidateVulnerability::CheckAllIntensityBinsPresent() {
/* Each vulnerability ID should have entries for all intensity bins in single
 * peril models. As it is not possible to establish from the vulnerability file
 * alone whether it belongs to a single peril model, this is issued as a
 * warning. This check can be supressed with a command line argument. */

  for (auto iter = vulIDToIntBinIDs_.begin(); iter != vulIDToIntBinIDs_.end();
       ++iter) {

    if (iter->second.size() != intensityBinIDs_.size()) {

      warnings_ = true;

      std::set<int> missingIntensityBins;
      std::set_difference(intensityBinIDs_.begin(), intensityBinIDs_.end(),
			  iter->second.begin(), iter->second.end(),
			  std::inserter(missingIntensityBins,
					missingIntensityBins.end()));

      char bins[5] = "bin";
      if (missingIntensityBins.size() > 1) strcat(bins, "s");
      fprintf(stderr, "WARNING: Vulnerability ID %d: Intensity %s ",
	      iter->first, bins);
      int numberOfMissingBinsLeft = missingIntensityBins.size();

      for (auto missBinsIter = missingIntensityBins.begin();
	   missBinsIter != missingIntensityBins.end(); ++missBinsIter) {
        fprintf(stderr, "%d", *missBinsIter);
	if (numberOfMissingBinsLeft > 2) {
          fprintf(stderr, ", ");
	} else if (numberOfMissingBinsLeft == 2) {
          fprintf(stderr, " and ");
	}
	--numberOfMissingBinsLeft;
      }
      fprintf(stderr, " missing. All intensity bins must be present for each"
		      " vulnerability ID in single peril models.\n");

    }

  }

}